

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall cmFileCopier::Install(cmFileCopier *this,char *fromFile,char *toFile)

{
  cmCommand *this_00;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  MatchProperties match_properties;
  ostringstream e;
  allocator local_1ca;
  allocator local_1c9;
  MatchProperties local_1c8;
  string local_1c0;
  string local_1a0 [11];
  
  if (*fromFile == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::operator<<((ostream *)local_1a0,"INSTALL encountered an empty string input file name.");
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(this_00,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    uVar2 = 0;
  }
  else {
    local_1c8 = CollectMatchProperties(this,fromFile);
    uVar2 = 1;
    if (((ulong)local_1c8 & 1) == 0) {
      std::__cxx11::string::string((string *)local_1a0,fromFile,&local_1c9);
      std::__cxx11::string::string((string *)&local_1c0,toFile,&local_1ca);
      bVar1 = cmsys::SystemTools::SameFile(local_1a0,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)local_1a0);
      if (!bVar1) {
        std::__cxx11::string::string((string *)local_1a0,fromFile,(allocator *)&local_1c0);
        bVar1 = cmsys::SystemTools::FileIsSymlink(local_1a0);
        std::__cxx11::string::~string((string *)local_1a0);
        if (bVar1) {
          uVar2 = InstallSymlink(this,fromFile,toFile);
        }
        else {
          std::__cxx11::string::string((string *)local_1a0,fromFile,(allocator *)&local_1c0);
          bVar1 = cmsys::SystemTools::FileIsDirectory(local_1a0);
          std::__cxx11::string::~string((string *)local_1a0);
          if (bVar1) {
            uVar2 = InstallDirectory(this,fromFile,toFile,&local_1c8);
          }
          else {
            bVar1 = cmsys::SystemTools::FileExists(fromFile);
            if (bVar1) {
              uVar2 = InstallFile(this,fromFile,toFile,&local_1c8);
            }
            else {
              iVar3 = (*this->_vptr_cmFileCopier[5])(this,fromFile);
              uVar2 = (undefined1)iVar3;
            }
          }
        }
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

bool cmFileCopier::Install(const char* fromFile, const char* toFile)
{
  if(!*fromFile)
    {
    std::ostringstream e;
    e << "INSTALL encountered an empty string input file name.";
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Collect any properties matching this file name.
  MatchProperties match_properties = this->CollectMatchProperties(fromFile);

  // Skip the file if it is excluded.
  if(match_properties.Exclude)
    {
    return true;
    }

  if(cmSystemTools::SameFile(fromFile, toFile))
    {
    return true;
    }
  else if(cmSystemTools::FileIsSymlink(fromFile))
    {
    return this->InstallSymlink(fromFile, toFile);
    }
  else if(cmSystemTools::FileIsDirectory(fromFile))
    {
    return this->InstallDirectory(fromFile, toFile, match_properties);
    }
  else if(cmSystemTools::FileExists(fromFile))
    {
    return this->InstallFile(fromFile, toFile, match_properties);
    }
  return this->ReportMissing(fromFile);
}